

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_aead_ctx.cc
# Opt level: O0

bool __thiscall
bssl::SSLAEADContext::Open
          (SSLAEADContext *this,Span<unsigned_char> *out,uint8_t type,uint16_t record_version,
          uint64_t seqnum,Span<const_unsigned_char> header,Span<unsigned_char> in)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  uchar *puVar6;
  byte *pbVar7;
  evp_aead_ctx_st *ctx;
  uchar *in_00;
  size_t in_len;
  uchar *ad_00;
  size_t ad_len;
  Span<unsigned_char> SVar8;
  uchar *local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t len;
  size_t i;
  size_t local_a0;
  size_t nonce_len;
  uint8_t nonce [32];
  undefined1 local_68 [8];
  Span<const_unsigned_char> ad;
  uint8_t ad_storage [13];
  size_t overhead;
  size_t plaintext_len;
  uint64_t seqnum_local;
  uint16_t record_version_local;
  uint8_t type_local;
  Span<unsigned_char> *out_local;
  SSLAEADContext *this_local;
  
  bVar2 = is_null_cipher(this);
  if ((bVar2) || (iVar3 = CRYPTO_fuzzer_mode_enabled(), iVar3 != 0)) {
    out->data_ = in.data_;
    out->size_ = in.size_;
    this_local._7_1_ = true;
  }
  else {
    overhead = 0;
    if (((byte)this->field_0x26a >> 3 & 1) == 0) {
      sVar4 = MaxOverhead(this);
      sVar5 = Span<unsigned_char>::size(&in);
      if (sVar5 < sVar4) {
        ERR_put_error(0x10,0,0x70,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0xf2);
        return false;
      }
      sVar5 = Span<unsigned_char>::size(&in);
      overhead = sVar5 - sVar4;
    }
    nonce._24_8_ = header.data_;
    _local_68 = GetAdditionalData(this,(uint8_t *)((long)&ad.size_ + 3),type,record_version,seqnum,
                                  overhead,header);
    local_a0 = 0;
    if (((byte)this->field_0x26a >> 2 & 1) == 0) {
      puVar6 = InplaceVector<unsigned_char,_32UL>::data(&this->fixed_nonce_);
      sVar4 = InplaceVector<unsigned_char,_32UL>::size(&this->fixed_nonce_);
      ::OPENSSL_memcpy(&nonce_len,puVar6,sVar4);
      sVar4 = InplaceVector<unsigned_char,_32UL>::size(&this->fixed_nonce_);
      local_a0 = sVar4 + local_a0;
    }
    else {
      local_a0 = InplaceVector<unsigned_char,_32UL>::size(&this->fixed_nonce_);
      local_a0 = local_a0 - this->variable_nonce_len_;
      ::OPENSSL_memset(&nonce_len,0,local_a0);
    }
    if ((this->field_0x26a & 1) == 0) {
      if (this->variable_nonce_len_ != '\b') {
        __assert_fail("variable_nonce_len_ == 8",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x113,
                      "bool bssl::SSLAEADContext::Open(Span<uint8_t> *, uint8_t, uint16_t, uint64_t, Span<const uint8_t>, Span<uint8_t>)"
                     );
      }
      CRYPTO_store_u64_be(nonce + (local_a0 - 8),seqnum);
    }
    else {
      sVar4 = Span<unsigned_char>::size(&in);
      if (sVar4 < this->variable_nonce_len_) {
        ERR_put_error(0x10,0,0x70,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x10d);
        return false;
      }
      lVar1 = local_a0 - 8;
      puVar6 = Span<unsigned_char>::data(&in);
      ::OPENSSL_memcpy(nonce + lVar1,puVar6,(ulong)this->variable_nonce_len_);
      _i = Span<unsigned_char>::subspan(&in,(ulong)this->variable_nonce_len_,0xffffffffffffffff);
      in.data_ = (uchar *)i;
    }
    sVar4 = this->variable_nonce_len_ + local_a0;
    local_a0 = sVar4;
    if (((byte)this->field_0x26a >> 2 & 1) != 0) {
      sVar5 = InplaceVector<unsigned_char,_32UL>::size(&this->fixed_nonce_);
      if (sVar4 != sVar5) {
        __assert_fail("nonce_len == fixed_nonce_.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_aead_ctx.cc"
                      ,0x11a,
                      "bool bssl::SSLAEADContext::Open(Span<uint8_t> *, uint8_t, uint16_t, uint64_t, Span<const uint8_t>, Span<uint8_t>)"
                     );
      }
      for (len = 0; sVar4 = len,
          sVar5 = InplaceVector<unsigned_char,_32UL>::size(&this->fixed_nonce_), sVar4 < sVar5;
          len = len + 1) {
        pbVar7 = InplaceVector<unsigned_char,_32UL>::operator[](&this->fixed_nonce_,len);
        nonce[len - 8] = nonce[len - 8] ^ *pbVar7;
      }
    }
    ctx = internal::StackAllocated<evp_aead_ctx_st,_void,_&EVP_AEAD_CTX_zero,_&EVP_AEAD_CTX_cleanup>
          ::get(&this->ctx_);
    puVar6 = Span<unsigned_char>::data(&in);
    sVar5 = Span<unsigned_char>::size(&in);
    sVar4 = local_a0;
    in_00 = Span<unsigned_char>::data(&in);
    in_len = Span<unsigned_char>::size(&in);
    ad_00 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)local_68);
    ad_len = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_68);
    iVar3 = EVP_AEAD_CTX_open(ctx,puVar6,&local_c0,sVar5,(uint8_t *)&nonce_len,sVar4,in_00,in_len,
                              ad_00,ad_len);
    if (iVar3 == 0) {
      this_local._7_1_ = false;
    }
    else {
      SVar8 = Span<unsigned_char>::subspan(&in,0,local_c0);
      local_d0 = SVar8.data_;
      out->data_ = local_d0;
      local_c8 = SVar8.size_;
      out->size_ = local_c8;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SSLAEADContext::Open(Span<uint8_t> *out, uint8_t type,
                          uint16_t record_version, uint64_t seqnum,
                          Span<const uint8_t> header, Span<uint8_t> in) {
  if (is_null_cipher() || CRYPTO_fuzzer_mode_enabled()) {
    // Handle the initial NULL cipher.
    *out = in;
    return true;
  }

  // TLS 1.2 AEADs include the length in the AD and are assumed to have fixed
  // overhead. Otherwise the parameter is unused.
  size_t plaintext_len = 0;
  if (!omit_length_in_ad_) {
    size_t overhead = MaxOverhead();
    if (in.size() < overhead) {
      // Publicly invalid.
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_PACKET_LENGTH);
      return false;
    }
    plaintext_len = in.size() - overhead;
  }

  uint8_t ad_storage[13];
  Span<const uint8_t> ad = GetAdditionalData(ad_storage, type, record_version,
                                             seqnum, plaintext_len, header);

  // Assemble the nonce.
  uint8_t nonce[EVP_AEAD_MAX_NONCE_LENGTH];
  size_t nonce_len = 0;

  // Prepend the fixed nonce, or left-pad with zeros if XORing.
  if (xor_fixed_nonce_) {
    nonce_len = fixed_nonce_.size() - variable_nonce_len_;
    OPENSSL_memset(nonce, 0, nonce_len);
  } else {
    OPENSSL_memcpy(nonce, fixed_nonce_.data(), fixed_nonce_.size());
    nonce_len += fixed_nonce_.size();
  }

  // Add the variable nonce.
  if (variable_nonce_included_in_record_) {
    if (in.size() < variable_nonce_len_) {
      // Publicly invalid.
      OPENSSL_PUT_ERROR(SSL, SSL_R_BAD_PACKET_LENGTH);
      return false;
    }
    OPENSSL_memcpy(nonce + nonce_len, in.data(), variable_nonce_len_);
    in = in.subspan(variable_nonce_len_);
  } else {
    assert(variable_nonce_len_ == 8);
    CRYPTO_store_u64_be(nonce + nonce_len, seqnum);
  }
  nonce_len += variable_nonce_len_;

  // XOR the fixed nonce, if necessary.
  if (xor_fixed_nonce_) {
    assert(nonce_len == fixed_nonce_.size());
    for (size_t i = 0; i < fixed_nonce_.size(); i++) {
      nonce[i] ^= fixed_nonce_[i];
    }
  }

  // Decrypt in-place.
  size_t len;
  if (!EVP_AEAD_CTX_open(ctx_.get(), in.data(), &len, in.size(), nonce,
                         nonce_len, in.data(), in.size(), ad.data(),
                         ad.size())) {
    return false;
  }
  *out = in.subspan(0, len);
  return true;
}